

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O0

blargg_err_t
read_strs(Data_Reader *in,long size,blargg_vector<char> *chars,blargg_vector<const_char_*> *strs)

{
  char *pcVar1;
  size_t sVar2;
  blargg_err_t pcVar3;
  char **ppcVar4;
  blargg_vector<const_char_*> *in_RCX;
  blargg_vector<char> *in_RDX;
  size_t in_RSI;
  blargg_vector<const_char_*> *in_RDI;
  bool bVar5;
  blargg_err_t blargg_return_err__3;
  int i;
  int count;
  blargg_err_t blargg_return_err__2;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  char *in_stack_ffffffffffffffa0;
  blargg_vector<char> *in_stack_ffffffffffffffa8;
  int local_48;
  int local_44;
  blargg_err_t local_8;
  
  local_8 = blargg_vector<char>::resize(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0)
  ;
  if (local_8 == (blargg_err_t)0x0) {
    pcVar1 = blargg_vector<char>::operator[](in_RDX,in_RSI);
    *pcVar1 = '\0';
    pcVar1 = blargg_vector<char>::operator[](in_RDX,0);
    local_8 = (blargg_err_t)(*(code *)in_RDI->begin_[3])(in_RDI,pcVar1,in_RSI);
    if ((local_8 == (blargg_err_t)0x0) &&
       (local_8 = blargg_vector<const_char_*>::resize(in_RDI,(size_t)in_stack_ffffffffffffffa0),
       local_8 == (blargg_err_t)0x0)) {
      local_44 = 0;
      for (local_48 = 0; (long)local_48 < (long)in_RSI; local_48 = local_48 + 1) {
        sVar2 = blargg_vector<const_char_*>::size(in_RCX);
        if (((int)sVar2 <= local_44) &&
           (pcVar3 = blargg_vector<const_char_*>::resize(in_RDI,(size_t)in_stack_ffffffffffffffa0),
           pcVar3 != (blargg_err_t)0x0)) {
          return pcVar3;
        }
        in_stack_ffffffffffffffa0 = blargg_vector<char>::operator[](in_RDX,(long)local_48);
        ppcVar4 = blargg_vector<const_char_*>::operator[](in_RCX,(long)local_44);
        *ppcVar4 = in_stack_ffffffffffffffa0;
        while( true ) {
          bVar5 = false;
          if ((long)local_48 < (long)in_RSI) {
            pcVar1 = blargg_vector<char>::operator[](in_RDX,(long)local_48);
            bVar5 = *pcVar1 != '\0';
          }
          if (!bVar5) break;
          local_48 = local_48 + 1;
        }
        local_44 = local_44 + 1;
      }
      local_8 = blargg_vector<const_char_*>::resize(in_RDI,(size_t)in_stack_ffffffffffffffa0);
    }
  }
  return local_8;
}

Assistant:

static blargg_err_t read_strs( Data_Reader& in, long size, blargg_vector<char>& chars,
		blargg_vector<const char*>& strs )
{
	RETURN_ERR( chars.resize( size + 1 ) );
	chars [size] = 0; // in case last string doesn't have terminator
	RETURN_ERR( in.read( &chars [0], size ) );
	
	RETURN_ERR( strs.resize( 128 ) );
	int count = 0;
	for ( int i = 0; i < size; i++ )
	{
		if ( (int) strs.size() <= count )
			RETURN_ERR( strs.resize( count * 2 ) );
		strs [count++] = &chars [i];
		while ( i < size && chars [i] )
			i++;
	}
	
	return strs.resize( count );
}